

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_any.hpp
# Opt level: O0

any * __thiscall iutest::any::operator=(any *this,int *rhs)

{
  any local_20;
  int *local_18;
  int *rhs_local;
  any *this_local;
  
  local_18 = rhs;
  rhs_local = (int *)this;
  any<int>(&local_20,rhs);
  swap(&local_20,this);
  ~any(&local_20);
  return this;
}

Assistant:

any& operator = (const   T& rhs) { any(rhs).swap(*this); return *this; }